

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lys_precompile_own_deviation(lysc_ctx *ctx,lysp_deviation *dev_p,lysp_module *pmod)

{
  void *pvVar1;
  lyd_node_inner *plVar2;
  ly_ht *plVar3;
  ulong uVar4;
  ly_bool lVar5;
  LY_ERR LVar6;
  lys_module *plVar7;
  lyd_node *plVar8;
  long *plVar9;
  lysc_node *plVar10;
  long lVar11;
  ulong uVar12;
  lysc_nodeid *nodeid1;
  lysc_nodeid *local_38;
  
  local_38 = (lysc_nodeid *)0x0;
  LVar6 = lys_precompile_nodeid(ctx->ctx,dev_p->nodeid,&local_38);
  nodeid1 = local_38;
  if (LVar6 != LY_SUCCESS) goto LAB_0014e2f7;
  plVar7 = lys_schema_node_get_module(ctx->ctx,*local_38->prefix,pmod);
  if (plVar7 == (lys_module *)0x0) {
    LVar6 = LY_EINT;
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
           ,0x8eb);
    goto LAB_0014e2f7;
  }
  LVar6 = LY_SUCCESS;
  if (plVar7 != ctx->cur_mod) goto LAB_0014e2f7;
  uVar4 = 0;
  do {
    uVar12 = uVar4;
    if ((ctx->devs).count <= uVar12) goto LAB_0014e376;
    plVar8 = (ctx->devs).field_2.dnodes[uVar12];
    lVar5 = lys_abs_schema_nodeid_match
                      (ctx->ctx,nodeid1,pmod,*(lysc_nodeid **)plVar8,
                       *(lysp_module **)&plVar8->parent->field_0);
    uVar4 = uVar12 + 1;
  } while (lVar5 == '\0');
  plVar8 = (ctx->devs).field_2.dnodes[uVar12];
  if (plVar8 == (lyd_node *)0x0) {
LAB_0014e376:
    plVar8 = (lyd_node *)calloc(1,0x20);
    if (plVar8 != (lyd_node *)0x0) {
      LVar6 = ly_set_add(&ctx->devs,plVar8,'\x01',(uint32_t *)0x0);
      if (LVar6 != LY_SUCCESS) goto LAB_0014e2f7;
      *(lysc_nodeid **)plVar8 = nodeid1;
      nodeid1 = (lysc_nodeid *)0x0;
      goto LAB_0014e3ad;
    }
  }
  else {
LAB_0014e3ad:
    plVar10 = plVar8->schema;
    if (plVar10 == (lysc_node *)0x0) {
      plVar9 = (long *)malloc(0x10);
      if (plVar9 != (long *)0x0) {
        *plVar9 = 1;
        lVar11 = 1;
        goto LAB_0014e422;
      }
    }
    else {
      pvVar1 = plVar10[-1].priv;
      plVar10[-1].priv = (void *)((long)pvVar1 + 1);
      plVar9 = (long *)realloc(&plVar10[-1].priv,(long)pvVar1 * 8 + 0x10);
      if (plVar9 != (long *)0x0) {
        lVar11 = *plVar9;
LAB_0014e422:
        plVar8->schema = (lysc_node *)(plVar9 + 1);
        plVar9[lVar11] = (long)dev_p;
        plVar2 = plVar8->parent;
        if (plVar2 == (lyd_node_inner *)0x0) {
          plVar9 = (long *)malloc(0x10);
          if (plVar9 == (long *)0x0) goto LAB_0014e496;
          lVar11 = 1;
          *plVar9 = 1;
        }
        else {
          plVar3 = plVar2[-1].children_ht;
          plVar2[-1].children_ht = (ly_ht *)((long)&plVar3->used + 1);
          plVar9 = (long *)realloc(&plVar2[-1].children_ht,(long)plVar3 * 8 + 0x10);
          if (plVar9 == (long *)0x0) {
            plVar10 = (lysc_node *)plVar8->parent;
            goto LAB_0014e492;
          }
          lVar11 = *plVar9;
        }
        plVar8->parent = (lyd_node_inner *)(plVar9 + 1);
        plVar9[lVar11] = (long)pmod;
        LVar6 = LY_SUCCESS;
        goto LAB_0014e2f7;
      }
      plVar10 = plVar8->schema;
LAB_0014e492:
      plVar10[-1].priv = (void *)((long)plVar10[-1].priv + -1);
    }
  }
LAB_0014e496:
  LVar6 = LY_EMEM;
  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_precompile_own_deviation"
        );
LAB_0014e2f7:
  lysc_nodeid_free(ctx->ctx,nodeid1);
  return LVar6;
}

Assistant:

static LY_ERR
lys_precompile_own_deviation(struct lysc_ctx *ctx, struct lysp_deviation *dev_p, const struct lysp_module *pmod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_deviation *dev = NULL;
    struct lysc_nodeid *nodeid = NULL;
    struct lysp_deviation **new_dev;
    const struct lys_module *mod;
    const struct lysp_module **new_dev_pmod;
    uint32_t i;

    /* parse its target, it was already parsed and fully checked (except for the existence of the nodes) */
    ret = lys_precompile_nodeid(ctx->ctx, dev_p->nodeid, &nodeid);
    LY_CHECK_GOTO(ret, cleanup);

    mod = lys_schema_node_get_module(ctx->ctx, nodeid->prefix[0], pmod);
    LY_CHECK_ERR_GOTO(!mod, LOGINT(ctx->ctx); ret = LY_EINT, cleanup);
    if (mod != ctx->cur_mod) {
        /* deviation for another module, ignore */
        goto cleanup;
    }

    /* try to find the node in already compiled deviations */
    for (i = 0; i < ctx->devs.count; ++i) {
        if (lys_abs_schema_nodeid_match(ctx->ctx, nodeid, pmod, ((struct lysc_deviation *)ctx->devs.objs[i])->nodeid,
                ((struct lysc_deviation *)ctx->devs.objs[i])->dev_pmods[0])) {
            dev = ctx->devs.objs[i];
            break;
        }
    }

    if (!dev) {
        /* allocate new compiled deviation */
        dev = calloc(1, sizeof *dev);
        LY_CHECK_ERR_GOTO(!dev, LOGMEM(ctx->ctx); ret = LY_EMEM, cleanup);
        LY_CHECK_GOTO(ret = ly_set_add(&ctx->devs, dev, 1, NULL), cleanup);

        dev->nodeid = nodeid;
        nodeid = NULL;
    }

    /* add new parsed deviation structure */
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->devs, new_dev, ret, cleanup);
    *new_dev = dev_p;
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->dev_pmods, new_dev_pmod, ret, cleanup);
    *new_dev_pmod = pmod;

cleanup:
    lysc_nodeid_free(ctx->ctx, nodeid);
    return ret;
}